

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O1

int loop(sockaddr_in *address)

{
  double dVar1;
  pointer pSVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  time_t tVar8;
  ostream *poVar9;
  long *plVar10;
  long lVar11;
  size_t sVar12;
  socklen_t __len;
  ulong __nbytes;
  size_type *psVar13;
  sockaddr *__addr;
  char *pcVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Type urn;
  Segment *segment;
  pointer pSVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  double dVar21;
  string mediaSession;
  string videoID;
  string state;
  string customState;
  string payload;
  Connection connection;
  CastMessage message;
  string msgLengthBuffer;
  string response;
  string type;
  timeval timeout;
  fd_set fdset;
  string local_2d8;
  int local_2b4;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  Connection local_210;
  string local_1e8;
  char local_1c8;
  undefined7 uStack_1c7;
  char *local_1b8;
  long local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  char *local_198;
  long local_190;
  char local_188;
  undefined7 uStack_187;
  undefined4 local_178;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  double local_130;
  SSL_CTX **local_128;
  SSL_METHOD *local_120;
  SSL_CTX *local_118 [2];
  SSL_CTX **local_108;
  SSL_METHOD *local_100;
  SSL_CTX *local_f8 [2];
  string local_e8;
  timeval local_c8;
  fd_set local_b8;
  
  __len = 0x11ed53;
  std::__cxx11::string::_M_replace(0x12a8e0,0,DAT_0012a8e8,0x11ed53);
  if (s_verbose == '\x01') {
    puts("Opening connection");
  }
  Connection::Connection(&local_210);
  iVar5 = Connection::connect(&local_210,(int)address,__addr,__len);
  if ((char)iVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to connect to ",0x15);
    pcVar14 = inet_ntoa((in_addr)(address->sin_addr).s_addr);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12b450);
    }
    else {
      sVar12 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,sVar12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    if (s_verbose == '\x01') {
      puts("Sending connection message");
    }
    bVar4 = cc::sendSimple(&local_210,Connect,Connection);
    if (bVar4) {
      puts("Connected");
      bVar4 = cc::sendSimple(&local_210,GetStatus,Receiver);
      if (bVar4) {
        s_lastPing = time((time_t *)0x0);
        iVar5 = 0;
        if ((s_running == '\0') && ((local_210.eof & 1U) == 0)) {
          do {
            local_b8.fds_bits[0xe] = 0;
            local_b8.fds_bits[0xf] = 0;
            local_b8.fds_bits[0xc] = 0;
            local_b8.fds_bits[0xd] = 0;
            local_b8.fds_bits[10] = 0;
            local_b8.fds_bits[0xb] = 0;
            local_b8.fds_bits[8] = 0;
            local_b8.fds_bits[9] = 0;
            local_b8.fds_bits[6] = 0;
            local_b8.fds_bits[7] = 0;
            local_b8.fds_bits[4] = 0;
            local_b8.fds_bits[5] = 0;
            local_b8.fds_bits[2] = 0;
            local_b8.fds_bits[3] = 0;
            local_b8.fds_bits[0] = 0;
            local_b8.fds_bits[1] = 0;
            uVar6 = local_210.fd + 0x3f;
            if (-1 < local_210.fd) {
              uVar6 = local_210.fd;
            }
            local_b8.fds_bits[(int)uVar6 >> 6] =
                 local_b8.fds_bits[(int)uVar6 >> 6] | 1L << ((byte)(local_210.fd % 0x40) & 0x3f);
            local_b8.fds_bits[0] = local_b8.fds_bits[0] | 1;
            local_c8.tv_sec = 1;
            local_c8.tv_usec = 0;
            iVar5 = select(local_210.fd + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
            dVar1 = currentPosition();
            dVar21 = currentDuration;
            if (((dVar1 < 0.0) || (currentDuration < 0.0)) || (s_lastPositionFetched < 0.0)) {
              printf("%s",s_currentStatus_abi_cxx11_._M_dataplus._M_p);
            }
            else {
              local_130 = dVar1;
              printf("\r[");
              iVar16 = (int)((local_130 * 40.0) / dVar21);
              iVar18 = 0x28;
              if (iVar16 < 0x28) {
                iVar18 = iVar16;
              }
              iVar17 = iVar18;
              if (0 < iVar16) {
                do {
                  putchar(0x3d);
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
              }
              iVar17 = 0x7c;
              if (currentlyPlaying != false) {
                iVar17 = 0x3e;
              }
              putchar(iVar17);
              if (iVar16 < 0x28) {
                iVar18 = iVar18 + -0x28;
                do {
                  putchar(0x2d);
                  iVar18 = iVar18 + 1;
                } while (iVar18 != 0);
              }
              printf("] ");
              iVar18 = (int)local_130;
              printf("%.2d:%.2d:%.2d",(ulong)(uint)((iVar18 / 0xe10) % 0x3c),
                     (ulong)(uint)((iVar18 / 0x3c) % 0x3c),(ulong)(uint)(iVar18 % 0x3c));
              putchar(0x2f);
              iVar18 = (int)dVar21;
              printf("%.2d:%.2d:%.2d",(ulong)(uint)((iVar18 / 0xe10) % 0x3c),
                     (ulong)(uint)((iVar18 / 0x3c) % 0x3c),(ulong)(uint)(iVar18 % 0x3c));
              pSVar2 = currentSegments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              for (pSVar19 = currentSegments.super__Vector_base<Segment,_std::allocator<Segment>_>.
                             _M_impl.super__Vector_impl_data._M_start; pSVar19 != pSVar2;
                  pSVar19 = pSVar19 + 1) {
                iVar16 = (int)((pSVar19->begin * 40.0) / dVar21);
                iVar18 = 0x27;
                if (iVar16 < 0x27) {
                  iVar18 = iVar16;
                }
                printf("\r\x1b[C");
                if (0 < iVar16) {
                  do {
                    printf("\x1b[C");
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                iVar18 = (int)(((pSVar19->end - pSVar19->begin) * 40.0) / dVar21);
                if (iVar18 < 2) {
                  iVar18 = 1;
                }
                do {
                  putchar(0x23);
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
            }
            fflush(_stdout);
            printf("\x1b[2K\r");
            if (iVar5 < 0) {
              perror("select()");
              piVar7 = __errno_location();
              local_2b4 = *piVar7;
              bVar4 = true;
            }
            else {
              piVar7 = __errno_location();
              if (*piVar7 != 4) {
                if ((local_b8.fds_bits[0] & 1U) != 0) {
                  uVar6 = getchar();
                  if (uVar6 == 0x71) {
LAB_00109a5d:
                    s_running = '\x01';
                    bVar15 = false;
                    local_2b4 = 0;
                  }
                  else if (uVar6 == 0x20) {
                    iVar18 = std::__cxx11::string::compare((char *)&s_currentStatus_abi_cxx11_);
                    if (iVar18 == 0) {
                      puts("Pausing");
                      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1e8,"PAUSE","");
                      cc::sendSimpleMedia(&local_210,&local_1e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                        operator_delete(local_1e8._M_dataplus._M_p,
                                        (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
                      }
                      bVar15 = true;
                    }
                    else {
                      iVar18 = std::__cxx11::string::compare((char *)&s_currentStatus_abi_cxx11_);
                      bVar15 = true;
                      if (iVar18 == 0) {
                        puts("Resuming playback");
                        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1e8,"PLAY","");
                        cc::sendSimpleMedia(&local_210,&local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                          operator_delete(local_1e8._M_dataplus._M_p,
                                          (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
                        }
                      }
                    }
                  }
                  else {
                    if (uVar6 == 0x1b) goto LAB_00109a5d;
                    bVar15 = true;
                    if (s_verbose == '\x01') {
                      printf("Unhandled key 0x%x\n",(ulong)uVar6);
                    }
                  }
                  bVar4 = true;
                  if (!bVar15) goto LAB_00109a07;
                }
                dVar1 = nextSegmentStart;
                if (iVar5 == 0) {
                  if ((0.0 < nextSegmentStart) &&
                     (tVar8 = time((time_t *)0x0), dVar1 <= (double)tVar8)) {
                    nextSegmentStart = -1.0;
                    cc::sendSimple(&local_210,GetStatus,Media);
                  }
                  tVar8 = time((time_t *)0x0);
                  bVar15 = true;
                  if (0x1e < tVar8 - s_lastPing) {
                    if (s_verbose == '\x01') {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Sending ping, last ping: ",0x19);
                      poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," current time: ",0xf);
                      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9," delta: ",8);
                      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9)
                      ;
                      std::ostream::put((char)poVar9);
                      std::ostream::flush();
                    }
                    bVar4 = cc::sendSimple(&local_210,Ping,Heartbeat);
                    if (bVar4) {
                      s_lastPing = time((time_t *)0x0);
                    }
                    else {
                      puts("Failed to send ping, assuming disconnected");
                      local_2b4 = 0x6e;
                      bVar15 = false;
                    }
                  }
                  bVar4 = true;
                  if (!bVar15) goto LAB_00109a07;
                }
                uVar6 = local_210.fd + 0x3f;
                if (-1 < local_210.fd) {
                  uVar6 = local_210.fd;
                }
                __nbytes = local_b8.fds_bits[(int)uVar6 >> 6];
                if ((__nbytes >> ((ulong)(uint)local_210.fd & 0x3f) & 1) != 0) {
                  Connection::read_abi_cxx11_
                            ((Connection *)&local_128,(int)&local_210,(void *)0x4,__nbytes);
                  if (local_120 == (SSL_METHOD *)0x4) {
                    if (local_210.eof == true) {
                      puts("Connection closed");
                      iVar5 = 0x68;
                      goto LAB_00109dfd;
                    }
                    uVar6 = *(uint *)local_128;
                    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                            uVar6 << 0x18;
                    if (0x10000 < uVar6) {
                      printf("Message length out of range: %d\n",(ulong)uVar6);
                      goto LAB_00109df8;
                    }
                    Connection::read_abi_cxx11_
                              ((Connection *)&local_108,(int)&local_210,(void *)(ulong)uVar6,
                               __nbytes);
                    if (local_100 < (SSL_METHOD *)(ulong)uVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Short read, expected ",0x15);
                      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9," got ",5);
                      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9)
                      ;
                      std::ostream::put((char)poVar9);
                      std::ostream::flush();
                      iVar5 = 0x4a;
LAB_0010ade2:
                      bVar4 = true;
                    }
                    else {
                      local_1e8._M_string_length = 0;
                      local_1e8._M_dataplus._M_p = (pointer)&PTR__CastMessage_001299f0;
                      local_1e8.field_2._M_allocated_capacity = (size_type)&local_1c8;
                      local_1e8.field_2._8_8_ = 0;
                      local_1c8 = '\0';
                      local_1b8 = &local_1a8;
                      local_1b0 = 0;
                      local_1a8 = '\0';
                      local_198 = &local_188;
                      local_190 = 0;
                      local_188 = '\0';
                      local_178 = 0;
                      local_170 = &local_160;
                      local_168 = 0;
                      local_160 = 0;
                      local_150 = &local_140;
                      local_148 = 0;
                      local_140 = 0;
                      bVar4 = ec::
                              cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                              ::parse((cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                                       *)&local_1e8,local_108,(size_t)local_100);
                      if (bVar4) {
                        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_250,local_170,local_170 + local_168);
                        if (local_250._M_string_length == 0) {
                          puts("No string payload");
                          bVar4 = true;
                        }
                        else {
                          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_290,"\"type\"\\s*:\\s*\"([^\"]+)\"","");
                          regexExtract(&local_e8,&local_290,&local_250);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_290._M_dataplus._M_p != &local_290.field_2) {
                            operator_delete(local_290._M_dataplus._M_p,
                                            local_290.field_2._M_allocated_capacity + 1);
                          }
                          iVar5 = std::__cxx11::string::compare((char *)&local_e8);
                          if ((iVar5 != 0) && (s_verbose == '\x01')) {
                            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)&std::cout,
                                                (char *)local_1e8.field_2._M_allocated_capacity,
                                                local_1e8.field_2._8_8_);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar9," > ",3);
                            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar9,local_1b8,local_1b0);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
                            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar9,local_198,local_190);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"): \n",4);
                            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar9,local_250._M_dataplus._M_p,
                                                local_250._M_string_length);
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) +
                                            (char)poVar9);
                            std::ostream::put((char)poVar9);
                            std::ostream::flush();
                          }
                          iVar5 = std::__cxx11::string::compare((char *)&local_e8);
                          if (iVar5 == 0) {
                            urn = Connect;
                            std::__cxx11::string::_M_replace
                                      (0x12a860,0,
                                       (char *)s_currentStatus_abi_cxx11_._M_string_length,0x11e852)
                            ;
LAB_0010a2ee:
                            bVar4 = true;
                            cc::sendSimple(&local_210,urn,urn);
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)&local_e8);
                            if (iVar5 == 0) {
                              std::__cxx11::string::_M_replace
                                        (0x12a860,0,
                                         (char *)s_currentStatus_abi_cxx11_._M_string_length,
                                         0x11f090);
                              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                 ((ostream *)&std::cout,
                                                  (char *)local_1e8.field_2._M_allocated_capacity,
                                                  local_1e8.field_2._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar9," > ",3);
                              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar9,local_1b8,local_1b0);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
                              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar9,local_198,local_190);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"): \n",4);
                              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar9,local_250._M_dataplus._M_p,
                                                  local_250._M_string_length);
                              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) +
                                              (char)poVar9);
                              std::ostream::put((char)poVar9);
                              std::ostream::flush();
                              bVar4 = false;
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)&local_e8);
                              if (iVar5 == 0) {
                                local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2d8,"\"duration\"\\s*:\\s*([0-9.]+)","")
                                ;
                                regexExtract(&local_290,&local_2d8,&local_250);
                                _Var3._M_p = local_290._M_dataplus._M_p;
                                if (local_290._M_string_length != 0) {
                                  local_2b0._M_dataplus._M_p = (pointer)0x0;
                                  dVar1 = strtod(local_290._M_dataplus._M_p,(char **)&local_2b0);
                                  if ((local_2b0._M_dataplus._M_p != _Var3._M_p) &&
                                     ((ulong)ABS(dVar1) < 0x7ff0000000000000 && *piVar7 != 0x22)) {
                                    currentDuration = dVar1;
                                  }
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                                  operator_delete(local_290._M_dataplus._M_p,
                                                  local_290.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                                  operator_delete(local_2d8._M_dataplus._M_p,
                                                  local_2d8.field_2._M_allocated_capacity + 1);
                                }
                                local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2d8,"\"currentTime\"\\s*:\\s*([0-9.]+)",
                                           "");
                                regexExtract(&local_290,&local_2d8,&local_250);
                                _Var3._M_p = local_290._M_dataplus._M_p;
                                if (local_290._M_string_length == 0) {
                                  bVar4 = false;
                                }
                                else {
                                  local_2b0._M_dataplus._M_p = (pointer)0x0;
                                  dVar1 = strtod(local_290._M_dataplus._M_p,(char **)&local_2b0);
                                  if ((local_2b0._M_dataplus._M_p == _Var3._M_p) ||
                                     (0x7fefffffffffffff < (ulong)ABS(dVar1) || *piVar7 == 0x22)) {
                                    bVar4 = false;
                                  }
                                  else {
                                    bVar4 = true;
                                    s_currentPosition = dVar1;
                                  }
                                }
                                paVar20 = &local_2d8.field_2;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                                  operator_delete(local_290._M_dataplus._M_p,
                                                  local_290.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2d8._M_dataplus._M_p != paVar20) {
                                  operator_delete(local_2d8._M_dataplus._M_p,
                                                  local_2d8.field_2._M_allocated_capacity + 1);
                                }
                                if (bVar4) {
                                  tVar8 = time((time_t *)0x0);
                                  s_lastPositionFetched = (double)tVar8;
                                }
                                local_2d8._M_dataplus._M_p = (pointer)paVar20;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2d8,
                                           "\"playerState\"\\s*:\\s*\"([A-Z]+)\"","");
                                regexExtract(&local_290,&local_2d8,&local_250);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2d8._M_dataplus._M_p != paVar20) {
                                  operator_delete(local_2d8._M_dataplus._M_p,
                                                  local_2d8.field_2._M_allocated_capacity + 1);
                                }
                                if (local_290._M_string_length != 0) {
                                  iVar5 = std::__cxx11::string::compare((char *)&local_290);
                                  currentlyPlaying = iVar5 == 0;
                                  std::__cxx11::string::_M_assign
                                            ((string *)&s_currentStatus_abi_cxx11_);
                                }
                                local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2b0,
                                           "\"mediaSessionId\"\\s*:\\s*([0-9]+)","");
                                regexExtract(&local_2d8,&local_2b0,&local_250);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                                  operator_delete(local_2b0._M_dataplus._M_p,
                                                  local_2b0.field_2._M_allocated_capacity + 1);
                                }
                                if (local_2d8._M_string_length != 0) {
                                  if (s_verbose == '\x01') {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Got media session ",0x12);
                                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                       ((ostream *)&std::cout,
                                                        local_2d8._M_dataplus._M_p,
                                                        local_2d8._M_string_length);
                                    std::endl<char,std::char_traits<char>>(poVar9);
                                  }
                                  std::__cxx11::string::_M_assign
                                            ((string *)&cc::mediaSession_abi_cxx11_);
                                }
                                if (s_youtube == '\x01') {
                                  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_270,
                                             "\"contentId\"\\s*:\\s*\"([A-Za-z0-9_-]+)\"","");
                                  regexExtract(&local_2b0,&local_270,&local_250);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_270._M_dataplus._M_p != &local_270.field_2) {
                                    operator_delete(local_270._M_dataplus._M_p,
                                                    local_270.field_2._M_allocated_capacity + 1);
                                  }
                                  if (s_verbose == '\x01') {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Video id: \'",0xb);
                                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                       ((ostream *)&std::cout,
                                                        local_2b0._M_dataplus._M_p,
                                                        local_2b0._M_string_length);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9,"\'",1);
                                    std::endl<char,std::char_traits<char>>(poVar9);
                                  }
                                  if ((local_2b0._M_string_length != 0) &&
                                     ((local_2b0._M_string_length !=
                                       currentVideo_abi_cxx11_._M_string_length ||
                                      (iVar5 = bcmp(local_2b0._M_dataplus._M_p,
                                                    currentVideo_abi_cxx11_._M_dataplus._M_p,
                                                    local_2b0._M_string_length), iVar5 != 0)))) {
                                    downloadSegments((vector<Segment,_std::allocator<Segment>_> *)
                                                     &local_270,&local_2b0);
                                    std::vector<Segment,_std::allocator<Segment>_>::_M_move_assign
                                              (&currentSegments,&local_270);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_270._M_dataplus._M_p !=
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)0x0) {
                                      operator_delete(local_270._M_dataplus._M_p,
                                                      local_270.field_2._M_allocated_capacity -
                                                      (long)local_270._M_dataplus._M_p);
                                    }
                                    std::__cxx11::string::_M_assign
                                              ((string *)&currentVideo_abi_cxx11_);
                                    nextSegmentStart = -1.0;
                                  }
                                  if (currentSegments.
                                      super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                      super__Vector_impl_data._M_start !=
                                      currentSegments.
                                      super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                      super__Vector_impl_data._M_finish) {
                                    dVar1 = secondsUntilNextSegment();
                                    if (s_verbose == '\x01') {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"time to next segment: ",0x16
                                                );
                                      poVar9 = std::ostream::_M_insert<double>(dVar1);
                                      std::endl<char,std::char_traits<char>>(poVar9);
                                    }
                                    if (0.0 <= dVar1) {
                                      tVar8 = time((time_t *)0x0);
                                      nextSegmentStart = dVar1 + (double)tVar8;
                                    }
                                    maybeSeek(&local_210);
                                  }
                                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_230,
                                             "\"playerState\"\\s*:\\s*(-?[0-9]+)","");
                                  regexExtract(&local_270,&local_230,&local_250);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                    operator_delete(local_230._M_dataplus._M_p,
                                                    CONCAT44(local_230.field_2._M_allocated_capacity
                                                             ._4_4_,local_230.field_2.
                                                                    _M_allocated_capacity._0_4_) + 1
                                                   );
                                  }
                                  if (s_verbose == '\x01') {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Custom player state: ",0x15);
                                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                       ((ostream *)&std::cout,
                                                        local_270._M_dataplus._M_p,
                                                        local_270._M_string_length);
                                    std::endl<char,std::char_traits<char>>(poVar9);
                                  }
                                  if ((s_adblock == '\x01') &&
                                     (iVar5 = std::__cxx11::string::compare((char *)&local_270),
                                     iVar5 == 0)) {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               " Playing an ad, attempting to skip",0x22);
                                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                                    dVar1 = currentPosition();
                                    dVar21 = 0.0;
                                    if (0.0 <= dVar1) {
                                      dVar21 = dVar1;
                                    }
                                    local_230.field_2._M_allocated_capacity._0_4_ = 0x504f5453;
                                    local_230._M_string_length = 4;
                                    local_230.field_2._M_allocated_capacity._4_4_ =
                                         local_230.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                                    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                                    cc::sendSimpleMedia(&local_210,&local_230);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                      operator_delete(local_230._M_dataplus._M_p,
                                                      CONCAT44(local_230.field_2.
                                                               _M_allocated_capacity._4_4_,
                                                               local_230.field_2.
                                                               _M_allocated_capacity._0_4_) + 1);
                                    }
                                    cc::loadMedia(&local_210,&currentVideo_abi_cxx11_,dVar21 + 1.0);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_270._M_dataplus._M_p != &local_270.field_2) {
                                    operator_delete(local_270._M_dataplus._M_p,
                                                    local_270.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                                    operator_delete(local_2b0._M_dataplus._M_p,
                                                    local_2b0.field_2._M_allocated_capacity + 1);
                                  }
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                                  operator_delete(local_2d8._M_dataplus._M_p,
                                                  local_2d8.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                                  operator_delete(local_290._M_dataplus._M_p,
                                                  local_290.field_2._M_allocated_capacity + 1);
                                }
                                bVar4 = true;
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)&local_198);
                                if (iVar5 == 0) {
                                  iVar5 = std::__cxx11::string::compare((char *)&local_e8);
                                  bVar4 = true;
                                  if (iVar5 == 0) {
                                    urn = Pong;
                                    goto LAB_0010a2ee;
                                  }
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)&local_198);
                                  if (iVar5 == 0) {
                                    iVar5 = std::__cxx11::string::compare((char *)&local_e8);
                                    bVar4 = true;
                                    if (iVar5 == 0) {
                                      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_2d8,
                                                 "\"displayName\"\\s*:\\s*\"([^\"]+)\"","");
                                      regexExtract(&local_290,&local_2d8,&local_250);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                                        operator_delete(local_2d8._M_dataplus._M_p,
                                                        local_2d8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_2b0,
                                                 "\"sessionId\"\\s*:\\s*\"([^\"]+)\"","");
                                      regexExtract(&local_2d8,&local_2b0,&local_250);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                                        operator_delete(local_2b0._M_dataplus._M_p,
                                                        local_2b0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if (s_verbose == '\x01') {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,"app display name: ",0x12);
                                        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                           ((ostream *)&std::cout,
                                                            local_290._M_dataplus._M_p,
                                                            local_290._M_string_length);
                                        std::endl<char,std::char_traits<char>>(poVar9);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,"session: ",9);
                                        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                           ((ostream *)&std::cout,
                                                            local_2d8._M_dataplus._M_p,
                                                            local_2d8._M_string_length);
                                        std::endl<char,std::char_traits<char>>(poVar9);
                                      }
                                      if (local_2d8._M_string_length != 0) {
                                        std::__cxx11::string::_M_assign
                                                  ((string *)&cc::dest_abi_cxx11_);
                                      }
                                      iVar5 = std::__cxx11::string::compare((char *)&local_290);
                                      if (iVar5 == 0) {
                                        s_youtube = '\x01';
                                        if (s_verbose == '\x01') {
                                          puts("Youtube playing");
                                        }
                                      }
                                      else if (local_290._M_string_length != 0) {
                                        s_youtube = '\0';
                                        std::operator+(&local_270,"Not youtube: \'",&local_290);
                                        plVar10 = (long *)std::__cxx11::string::append
                                                                    ((char *)&local_270);
                                        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
                                        psVar13 = (size_type *)(plVar10 + 2);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)*plVar10 ==
                                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)psVar13) {
                                          local_2b0.field_2._M_allocated_capacity = *psVar13;
                                          local_2b0.field_2._8_8_ = plVar10[3];
                                        }
                                        else {
                                          local_2b0.field_2._M_allocated_capacity = *psVar13;
                                          local_2b0._M_dataplus._M_p = (pointer)*plVar10;
                                        }
                                        local_2b0._M_string_length = plVar10[1];
                                        *plVar10 = (long)psVar13;
                                        plVar10[1] = 0;
                                        *(undefined1 *)(plVar10 + 2) = 0;
                                        std::__cxx11::string::operator=
                                                  ((string *)&s_currentStatus_abi_cxx11_,
                                                   (string *)&local_2b0);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                                          operator_delete(local_2b0._M_dataplus._M_p,
                                                          local_2b0.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_270._M_dataplus._M_p != &local_270.field_2) {
                                          operator_delete(local_270._M_dataplus._M_p,
                                                          local_270.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                      }
                                      lVar11 = std::__cxx11::string::find
                                                         ((char *)&local_250,0x11eed5,0);
                                      if (lVar11 != -1) {
                                        if (s_verbose == '\x01') {
                                          puts("Sending get status for media");
                                        }
                                        cc::sendSimple(&local_210,Connect,Connection);
                                        cc::sendSimple(&local_210,GetStatus,Media);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                                        operator_delete(local_2d8._M_dataplus._M_p,
                                                        local_2d8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_290._M_dataplus._M_p != &local_290.field_2) {
                                        operator_delete(local_290._M_dataplus._M_p,
                                                        local_290.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                    }
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)&local_e8);
                                    bVar4 = true;
                                    if (iVar5 != 0) {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cerr,"Unhandled message type: ",
                                                 0x18);
                                      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                         ((ostream *)&std::cerr,
                                                          local_e8._M_dataplus._M_p,
                                                          local_e8._M_string_length);
                                      std::endl<char,std::char_traits<char>>(poVar9);
                                    }
                                  }
                                }
                              }
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                            operator_delete(local_e8._M_dataplus._M_p,
                                            local_e8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_250._M_dataplus._M_p != &local_250.field_2) {
                          operator_delete(local_250._M_dataplus._M_p,
                                          local_250.field_2._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        puts("Parsing message from chromecast failed");
                        bVar4 = false;
                      }
                      local_1e8._M_dataplus._M_p = (pointer)&PTR__CastMessage_001299f0;
                      if (local_150 != &local_140) {
                        operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
                      }
                      if (local_170 != &local_160) {
                        operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
                      }
                      if (local_198 != &local_188) {
                        operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
                      }
                      if (local_1b8 != &local_1a8) {
                        operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
                      }
                      if ((char *)local_1e8.field_2._M_allocated_capacity != &local_1c8) {
                        operator_delete((void *)local_1e8.field_2._M_allocated_capacity,
                                        CONCAT71(uStack_1c7,local_1c8) + 1);
                      }
                      if (!bVar4) {
                        pcVar14 = "Failed to parse message";
LAB_0010add8:
                        puts(pcVar14);
                        iVar5 = 0x68;
                        goto LAB_0010ade2;
                      }
                      if (local_210.eof == true) {
                        pcVar14 = "Disconnected";
                        goto LAB_0010add8;
                      }
                      bVar4 = false;
                      s_lastPing = time((time_t *)0x0);
                      iVar5 = local_2b4;
                    }
                    if (local_108 != local_f8) {
                      operator_delete(local_108,(long)local_f8[0] + 1);
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Failed to read message size: \'",0x1e);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cerr,(char *)local_128,(long)local_120);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
LAB_00109df8:
                    iVar5 = 0x4a;
LAB_00109dfd:
                    bVar4 = true;
                  }
                  local_2b4 = iVar5;
                  if (local_128 != local_118) {
                    operator_delete(local_128,(long)local_118[0] + 1);
                  }
                  goto LAB_00109a07;
                }
              }
              bVar4 = false;
            }
LAB_00109a07:
            iVar5 = local_2b4;
            if (bVar4) break;
            iVar5 = 0;
            if ((s_running != '\0') || (iVar5 = 0, (local_210.eof & 1U) != 0)) break;
          } while( true );
        }
        goto LAB_0010b00b;
      }
      pcVar14 = "Failed to send getstatus message";
    }
    else {
      pcVar14 = "Failed to send connect message";
    }
    puts(pcVar14);
  }
  piVar7 = __errno_location();
  iVar5 = *piVar7;
LAB_0010b00b:
  Connection::~Connection(&local_210);
  return iVar5;
}

Assistant:

int loop(const sockaddr_in &address)
{
    cc::dest = "";

    if (s_verbose) {
        puts("Opening connection");
    }
    Connection connection;
    if (!connection.connect(address)) {
        std::cerr << "Failed to connect to " << inet_ntoa(address.sin_addr) << std::endl;
        return errno;
    }
    if (s_verbose) {
        puts("Sending connection message");
    }
    if (!cc::sendSimple(connection, cc::msg::Connect, cc::ns::Connection)) {
        puts("Failed to send connect message");
        return errno;
    }
    puts("Connected");
    if (!cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Receiver)) {
        puts("Failed to send getstatus message");
        return errno;
    }
    s_lastPing = time(nullptr);

    while (s_running && !connection.eof) {
        fd_set fdset;
        FD_ZERO(&fdset);
        FD_SET(connection.fd, &fdset);
        FD_SET(STDIN_FILENO, &fdset);

        timeval timeout;
        timeout.tv_sec = 1; // max 1 second so we can update the progress bar
        timeout.tv_usec = 0;
        const int events = select(connection.fd + 1, &fdset, 0, 0, &timeout);
        printProgress(currentPosition(), currentDuration);

        if (events < 0) {
            perror("select()");
            return errno;
        }
        if (errno == EINTR) {
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fdset)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                s_running = false;
                return 0;
            case ' ':
                if (s_currentStatus == "PLAYING") {
                    puts("Pausing");
                    cc::sendSimpleMedia(connection, "PAUSE");
                } else if (s_currentStatus == "PAUSED") {
                    puts("Resuming playback");
                    cc::sendSimpleMedia(connection, "PLAY");
                }
                break;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }

        if (events == 0) { // timeout
            if (nextSegmentStart > 0 && nextSegmentStart <= time(nullptr)) {
                nextSegmentStart = -1;
                // Update to make sure we are in sync before we skip the sponsor
                cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Media);
            }

            const time_t currentTime = time(nullptr);
            if (currentTime - s_lastPing > PING_INTERVAL) {
                if (s_verbose) {
                    std::cout << "Sending ping, last ping: " << s_lastPing << " current time: " << currentTime << " delta: " << (currentTime - s_lastPing) << std::endl;
                }
                if (!cc::sendSimple(connection, cc::msg::Ping, cc::ns::Heartbeat)) {
                    puts("Failed to send ping, assuming disconnected");
                    return ETIMEDOUT;
                }
                s_lastPing = time(nullptr);
            }
        }

        if (!FD_ISSET(connection.fd, &fdset)) {
            continue;
        }

        std::string msgLengthBuffer = connection.read(sizeof(uint32_t));
        if (msgLengthBuffer.size() != 4) {
            std::cerr << "Failed to read message size: '" << msgLengthBuffer << "'" << std::endl;
            return EBADMSG;
        }
        if (connection.eof) {
            puts("Connection closed");
            return ECONNRESET;
        }
        uint32_t msgLength = 0;
        memcpy(&msgLength, msgLengthBuffer.data(), sizeof msgLength);
        msgLength = ntohl(msgLength);
        if (msgLength > 64 * 1024) { // 64kb max according to the spec
            printf("Message length out of range: %d\n", msgLength);
            return EBADMSG;
        }

        std::string response = connection.read(msgLength);
        if (response.size() < msgLength) {
            std::cerr << "Short read, expected " << msgLength << " got " << response.size() << std::endl;
            return EBADMSG;
        }
        if (!handleMessage(&connection, response)) {
            puts("Failed to parse message");
            return ECONNRESET;
        }
        if (connection.eof) {
            puts("Disconnected");
            return ECONNRESET;
        }

        // We got a valid message
        s_lastPing = time(nullptr);
    }
    return 0;
}